

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[46],std::__cxx11::string,char[104]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [46],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [104])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [104];
  char (*args_local_2) [104];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [46];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [104])args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [46])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_98 = cmAlphaNum::View(a);
  local_88 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_c8,(char *)args_local_1);
  local_78 = cmAlphaNum::View(&local_c8);
  cmAlphaNum::cmAlphaNum(&local_f8,(string *)args_local_2);
  local_68 = cmAlphaNum::View(&local_f8);
  cmAlphaNum::cmAlphaNum(&local_128,*local_38);
  local_58 = cmAlphaNum::View(&local_128);
  local_48 = &local_98;
  local_40 = 5;
  views._M_len = 5;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}